

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

void __thiscall OpenMD::Snapshot::setHmat(Snapshot *this,Mat3x3d *m)

{
  int i;
  long lVar1;
  bool bVar2;
  int j;
  long lVar3;
  bool bVar4;
  Mat3x3d *this_00;
  double dVar5;
  double dVar6;
  RectMatrix<double,_3U,_3U> local_60;
  
  this->hasVolume = false;
  this_00 = &(this->frameData).hmat;
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)this_00,(RectMatrix<double,_3U,_3U> *)m);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)&local_60,this_00);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).invHmat,&local_60);
  dVar5 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0][0]);
  dVar6 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[1][1]);
  if (dVar5 <= dVar6) {
    dVar6 = dVar5;
  }
  dVar5 = ABS((this->frameData).hmat.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[2][2]);
  if (dVar6 <= dVar5) {
    dVar5 = dVar6;
  }
  dVar6 = this->orthoTolerance_;
  (this->frameData).orthoRhombic = true;
  bVar4 = true;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    bVar2 = bVar4;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      if (((lVar1 != lVar3) && (bVar4)) &&
         (dVar5 * dVar6 <=
          ABS((this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar3]))) {
        (this->frameData).orthoRhombic = false;
        bVar2 = false;
        bVar4 = false;
      }
    }
    this_00 = (Mat3x3d *)
              ((this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    bVar4 = bVar2;
  }
  return;
}

Assistant:

void Snapshot::setHmat(const Mat3x3d& m) {
    hasVolume         = false;
    frameData.hmat    = m;
    frameData.invHmat = frameData.hmat.inverse();

    // determine whether the box is orthoTolerance or not
    bool oldOrthoRhombic = frameData.orthoRhombic;

    RealType smallDiag = fabs(frameData.hmat(0, 0));
    if (smallDiag > fabs(frameData.hmat(1, 1)))
      smallDiag = fabs(frameData.hmat(1, 1));
    if (smallDiag > fabs(frameData.hmat(2, 2)))
      smallDiag = fabs(frameData.hmat(2, 2));
    RealType tol = smallDiag * orthoTolerance_;

    frameData.orthoRhombic = true;

    for (int i = 0; i < 3; i++) {
      for (int j = 0; j < 3; j++) {
        if (i != j) {
          if (frameData.orthoRhombic) {
            if (fabs(frameData.hmat(i, j)) >= tol)
              frameData.orthoRhombic = false;
          }
        }
      }
    }

    if (oldOrthoRhombic != frameData.orthoRhombic) {
      // It is finally time to suppress these warnings once and for
      // all.  They were annoying and not very informative.

      // if( frameData.orthoRhombic ) {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the default Non-Orthorhombic\n"
      //   	 "\tto the faster Orthorhombic periodic boundary
      //   computations.\n"
      //   	 "\tThis is usually a good thing, but if you want the\n"
      //   	 "\tNon-Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) smaller.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_INFO;
      //   simError();
      // }
      // else {
      //   snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
      //   	 "OpenMD is switching from the faster Orthorhombic to the
      //   more\n"
      //   	 "\tflexible Non-Orthorhombic periodic boundary computations.\n"
      //   	 "\tThis is usually because the box has deformed under\n"
      //   	 "\tNPTf integration. If you want to live on the edge with\n"
      //   	 "\tthe Orthorhombic computations, make the orthoBoxTolerance\n"
      //   	 "\tvariable ( currently set to %G ) larger.\n",
      //   	 orthoTolerance_);
      //   painCave.severity = OPENMD_WARNING;
      //   simError();
      // }
    }
  }